

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O3

void __thiscall
cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph
          (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *this,
          DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *depgraph,
          Span<const_unsigned_int> mapping)

{
  pointer pEVar1;
  ulong uVar2;
  pointer pEVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  bool local_32;
  allocator_type local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ::vector(&this->entries,
           ((long)(depgraph->entries).
                  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(depgraph->entries).
                  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,&local_31);
  local_32 = ((long)(depgraph->entries).
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(depgraph->entries).
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
             mapping.m_size == 0;
  inline_assertion_check<true,bool>
            (&local_32,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/cluster_linearize.h"
             ,0x7f,"DepGraph","mapping.size() == depgraph.TxCount()");
  pEVar3 = (depgraph->entries).
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((depgraph->entries).
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_finish != pEVar3) {
    uVar2 = 0;
    do {
      uVar9 = mapping.m_data[uVar2];
      pEVar1 = (this->entries).
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar1[uVar9].feerate.size = pEVar3[uVar2].feerate.size;
      pEVar1[uVar9].feerate.fee = pEVar3[uVar2].feerate.fee;
      uVar8 = pEVar3[uVar2].ancestors.m_val;
      if (uVar8 != 0) {
        uVar7 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        uVar6 = pEVar1[uVar9].ancestors.m_val;
        do {
          uVar6 = uVar6 | 1 << ((byte)mapping.m_data[uVar7] & 0x1f);
          pEVar1[uVar9].ancestors.m_val = uVar6;
          uVar8 = uVar8 - 1 & uVar8;
          uVar7 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
        } while (uVar8 != 0);
      }
      uVar2 = (ulong)((int)uVar2 + 1);
      pEVar3 = (depgraph->entries).
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(depgraph->entries).
                     super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3 >> 3) *
              -0x5555555555555555;
    } while (uVar2 <= uVar4 && uVar4 - uVar2 != 0);
  }
  pEVar3 = (this->entries).
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->entries).
                super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3;
  if (lVar5 != 0) {
    uVar4 = (lVar5 >> 3) * -0x5555555555555555;
    uVar2 = 0;
    do {
      uVar9 = pEVar3[uVar2].ancestors.m_val;
      if (uVar9 != 0) {
        uVar8 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        do {
          pEVar3[uVar8].descendants.m_val =
               pEVar3[uVar8].descendants.m_val | 1 << ((byte)uVar2 & 0x1f);
          uVar9 = uVar9 - 1 & uVar9;
          uVar8 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
        } while (uVar9 != 0);
      }
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (uVar2 <= uVar4 && uVar4 - uVar2 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DepGraph(const DepGraph<SetType>& depgraph, Span<const ClusterIndex> mapping) noexcept : entries(depgraph.TxCount())
    {
        Assert(mapping.size() == depgraph.TxCount());
        // Fill in fee, size, ancestors.
        for (ClusterIndex i = 0; i < depgraph.TxCount(); ++i) {
            const auto& input = depgraph.entries[i];
            auto& output = entries[mapping[i]];
            output.feerate = input.feerate;
            for (auto j : input.ancestors) output.ancestors.Set(mapping[j]);
        }
        // Fill in descendant information.
        for (ClusterIndex i = 0; i < entries.size(); ++i) {
            for (auto j : entries[i].ancestors) {
                entries[j].descendants.Set(i);
            }
        }
    }